

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adapter.cc
# Opt level: O2

bool __thiscall RaptorServerAdapter::Init(RaptorServerAdapter *this,RaptorOptions *options)

{
  raptor_error e;
  string local_28;
  
  raptor::TcpServer::Init
            ((TcpServer *)&e,
             (RaptorOptions *)
             (this->_impl).super___shared_ptr<raptor::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  if (e._value != (Status *)0x0) {
    raptor::Status::ToString_abi_cxx11_(&local_28,e._value);
    raptor::LogFormatPrint
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/adapter.cc"
               ,0x29,kLogLevelError,"server adapter: init (%s)",local_28._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_28);
  }
  raptor::RefCountedPtr<raptor::Status>::~RefCountedPtr(&e);
  return e._value == (Status *)0x0;
}

Assistant:

bool RaptorServerAdapter::Init(const RaptorOptions* options) {
    raptor_error e = _impl->Init(options);
    if (e != RAPTOR_ERROR_NONE) {
        log_error("server adapter: init (%s)", e->ToString().c_str());
        return false;
    }
    return true;
}